

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIFactoredRewardDecPOMDPDiscrete.cpp
# Opt level: O0

string * __thiscall
TOIFactoredRewardDecPOMDPDiscrete::SoftPrint_abi_cxx11_(TOIFactoredRewardDecPOMDPDiscrete *this)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  void *this_00;
  const_reference ppRVar4;
  undefined8 uVar5;
  long *in_RSI;
  string *in_RDI;
  uint i;
  stringstream ss;
  char *in_stack_fffffffffffffde8;
  E *in_stack_fffffffffffffdf0;
  string local_1e8 [32];
  uint local_1c8;
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [368];
  TOIDecPOMDPDiscrete *in_stack_ffffffffffffffe8;
  
  std::__cxx11::stringstream::stringstream(local_198);
  TOIDecPOMDPDiscrete::SoftPrint_abi_cxx11_(in_stack_ffffffffffffffe8);
  std::operator<<(local_188,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  if ((*(byte *)(in_RSI + 0x57) & 1) != 0) {
    poVar1 = std::operator<<(local_188,"Reward models: ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_1c8 = 0;
    while( true ) {
      uVar2 = (ulong)local_1c8;
      uVar3 = (**(code **)(*in_RSI + 0x10))();
      if (uVar2 == uVar3) break;
      poVar1 = std::operator<<(local_188,"Individual rewards for agent ");
      this_00 = (void *)std::ostream::operator<<(poVar1,local_1c8);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      ppRVar4 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::operator[]
                          ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)(in_RSI + 0x58),
                           (ulong)local_1c8);
      (*((*ppRVar4)->super_RewardModelDiscreteInterface).super_QTableInterface._vptr_QTableInterface
        [5])(local_1e8);
      std::operator<<(local_188,local_1e8);
      std::__cxx11::string::~string(local_1e8);
      local_1c8 = local_1c8 + 1;
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_198);
    return in_RDI;
  }
  uVar5 = __cxa_allocate_exception(0x28);
  E::E(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  __cxa_throw(uVar5,&E::typeinfo,E::~E);
}

Assistant:

string TOIFactoredRewardDecPOMDPDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << TOIDecPOMDPDiscrete::SoftPrint();

    if(_m_initialized)
    {
        ss << "Reward models: " << endl;
        for(unsigned int i=0;i!=GetNrAgents();++i)
        {
            ss << "Individual rewards for agent " << i << endl;
            ss << _m_p_rModels[i]->SoftPrint();
        }
    }
    else
        throw E("TOIFactoredRewardDecPOMDPDiscrete components (reward model) not initialized");

    return(ss.str());
}